

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

ON_2dPoint __thiscall
ON_OBSOLETE_V5_DimLinear::Dim2dPoint(ON_OBSOLETE_V5_DimLinear *this,int point_index)

{
  ON_2dPoint *pOVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  ON_2dPoint OVar6;
  ON_2dPoint OVar7;
  
  dVar4 = -1.23432101234321e+308;
  if ((this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count < 5)
  {
    OVar6.y = -1.23432101234321e+308;
    OVar6.x = -1.23432101234321e+308;
    return OVar6;
  }
  iVar2 = 0x2711;
  if (((this->super_ON_OBSOLETE_V5_Annotation).m_userpositionedtext & 1U) != 0) {
    iVar2 = 4;
  }
  if (point_index != 10000) {
    iVar2 = point_index;
  }
  pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
  switch(iVar2) {
  case 0:
    dVar4 = pOVar1->x;
    lVar3 = 8;
    break;
  case 1:
    dVar4 = pOVar1->x;
    goto LAB_004ab22e;
  case 2:
    dVar4 = pOVar1[2].x;
    lVar3 = 0x28;
    break;
  case 3:
    dVar4 = pOVar1[2].x;
    goto LAB_004ab22e;
  case 4:
    dVar4 = pOVar1[4].x;
    lVar3 = 0x48;
    break;
  default:
    dVar5 = -1.23432101234321e+308;
    if (iVar2 != 0x2711) goto LAB_004ab238;
    dVar4 = (pOVar1->x + pOVar1[2].x) * 0.5;
LAB_004ab22e:
    lVar3 = 0x18;
  }
  dVar5 = *(double *)((long)&pOVar1->x + lVar3);
LAB_004ab238:
  OVar7.y = dVar5;
  OVar7.x = dVar4;
  return OVar7;
}

Assistant:

ON_2dPoint ON_OBSOLETE_V5_DimLinear::Dim2dPoint( int point_index ) const
{
  ON_2dPoint p2;
  if ( m_points.Count() < dim_pt_count )
  {
    p2.x = p2.y = ON_UNSET_VALUE;
  }
  else
  {
    if ( text_pivot_pt == point_index )
    {
      point_index = m_userpositionedtext ? userpositionedtext_pt_index : dim_mid_pt;
    }

    const ON_2dPoint* points = m_points.Array();
    switch(point_index)
    {
    case ext0_pt_index:
      p2 = points[0];
      break;

    case arrow0_pt_index:
      p2.x = points[0].x;
      p2.y = points[1].y;
      break;

    case ext1_pt_index:
      p2 = points[2];
      break;

    case arrow1_pt_index:
      p2.x = points[2].x;
      p2.y = points[1].y;
      break;

    case userpositionedtext_pt_index:
      p2.x = points[4].x;
      p2.y = points[4].y;
      break;

    case dim_mid_pt:
      p2.x = 0.5*(points[0].x + points[2].x);
      p2.y = points[1].y;
      break;

    default:
      p2.x = p2.y = ON_UNSET_VALUE;
      break;
    }
  }
  return p2;
}